

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::ReportLeaks(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ConfigFlagsTable *pCVar4;
  Recycler *this_00;
  undefined4 *puVar5;
  char *obj;
  undefined1 local_5e8 [8];
  Param param;
  TrackAllocData local_80;
  char *local_58;
  FakeMemory *f;
  Recycler *pRStack_48;
  AutoHandledExceptionType __autoHandledExceptionType;
  Recycler *this_local;
  void *buffer;
  
  pRStack_48 = this;
  pCVar4 = GetRecyclerFlagsTable(this);
  bVar2 = Js::ConfigFlagsTable::IsEnabled(pCVar4,LeakReportFlag);
  if (bVar2) {
    pCVar4 = GetRecyclerFlagsTable(this);
    if ((pCVar4->ForceMemoryLeak & 1U) != 0) {
      AutoHandledExceptionType::AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&f + 7),ExceptionType_DisableCheck);
      TrackAllocData::CreateTrackAllocData
                (&local_80,(type_info *)&ReportLeaks()::FakeMemory::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                 ,0x21df);
      this_00 = TrackAllocInfo(this,&local_80);
      param.stats._1328_8_ = AllocInlined;
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      obj = AllocInlined(this_00,4);
      if (obj == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_58 = obj;
      RootAddRef(this,obj,(uint *)0x0);
      AutoHandledExceptionType::~AutoHandledExceptionType
                ((AutoHandledExceptionType *)((long)&f + 7));
    }
    LeakReport::StartSection(L"Object Graph");
    LeakReport::StartRedirectOutput();
    memset(local_5e8,0,0x548);
    param.dumpReferenceFunc._1_1_ = 1;
    bVar2 = DumpObjectGraph(this,(Param *)local_5e8);
    if (!bVar2) {
      LeakReport::Print(
                       L"--------------------------------------------------------------------------------\n"
                       );
      LeakReport::Print(L"ERROR: Out of memory generating leak report\n");
      param.stats.markData.rescanLargeByteCount = 0;
    }
    LeakReport::EndRedirectOutput();
    if (param.stats.markData.rescanLargeByteCount != 0) {
      LeakReport::Print(
                       L"--------------------------------------------------------------------------------\n"
                       );
      LeakReport::Print(L"Recycler Leaked Object: %d bytes (%d objects)\n",
                        param.stats.markData.markCount,param.stats.markData.rescanLargeByteCount);
      pCVar4 = GetRecyclerFlagsTable(this);
      if ((pCVar4->LeakStackTrace & 1U) != 0) {
        LeakReport::StartSection(L"Pinned object stack traces");
        LeakReport::StartRedirectOutput();
        PrintPinnedObjectStackTraces(this);
        LeakReport::EndRedirectOutput();
        LeakReport::EndSection();
      }
    }
    LeakReport::EndSection();
  }
  return;
}

Assistant:

void
Recycler::ReportLeaks()
{
    if (GetRecyclerFlagsTable().IsEnabled(Js::LeakReportFlag))
    {
        if (GetRecyclerFlagsTable().ForceMemoryLeak)
        {
            AUTO_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
            struct FakeMemory { Field(int) f; };
            FakeMemory * f = RecyclerNewStruct(this, FakeMemory);
            this->RootAddRef(f);
        }

        LeakReport::StartSection(_u("Object Graph"));
        LeakReport::StartRedirectOutput();

        RecyclerObjectGraphDumper::Param param = { 0 };
        param.skipStack = true;
        if (!this->DumpObjectGraph(&param))
        {
            LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
            LeakReport::Print(_u("ERROR: Out of memory generating leak report\n"));
            param.stats.markData.markCount = 0;
        }

        LeakReport::EndRedirectOutput();

        if (param.stats.markData.markCount != 0)
        {
            LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
            LeakReport::Print(_u("Recycler Leaked Object: %d bytes (%d objects)\n"),
                param.stats.markData.markBytes, param.stats.markData.markCount);

#ifdef STACK_BACK_TRACE
            if (GetRecyclerFlagsTable().LeakStackTrace)
            {
                LeakReport::StartSection(_u("Pinned object stack traces"));
                LeakReport::StartRedirectOutput();
                this->PrintPinnedObjectStackTraces();
                LeakReport::EndRedirectOutput();
                LeakReport::EndSection();
            }
#endif
        }
        LeakReport::EndSection();
    }
}